

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  DescriptorBuilder *this_00;
  FieldDescriptor *pFVar1;
  Message *pMVar2;
  scoped_ptr<google::protobuf::UnknownFieldSet> p;
  const_iterator intermediate_fields_iter;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  undefined4 extraout_var_01;
  UnknownFieldSet *pUVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  undefined4 extraout_var_02;
  size_type *psVar10;
  _func_int **pp_Var11;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar12;
  UninterpretedOption *pUVar13;
  iterator iVar14;
  anon_union_8_7_bfa3a334_for_Symbol_2 this_01;
  _Alloc_hider _Var15;
  long lVar16;
  Symbol SVar17;
  CodedOutputStream out;
  FieldDescriptor *field;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  StringOutputStream outstr;
  undefined1 local_120 [32];
  undefined1 local_100 [63];
  LogFinisher local_c1;
  Message *local_c0;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_b8;
  scoped_ptr<google::protobuf::UnknownFieldSet> local_b0;
  string local_a8;
  const_iterator local_88;
  iterator iStack_80;
  FieldDescriptor **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  StringOutputStream local_50;
  _func_int *local_40;
  long lStack_38;
  
  pUVar13 = this->uninterpreted_option_;
  iVar4 = (pUVar13->name_).super_RepeatedPtrFieldBase.current_size_;
  local_c0 = options;
  if (iVar4 == 0) {
    local_100._0_8_ = local_100 + 0x10;
    local_a8._M_dataplus._M_p = (char *)0x18;
    local_100._0_8_ = std::__cxx11::string::_M_create((ulong *)local_100,(ulong)&local_a8);
    local_100._16_8_ = local_a8._M_dataplus._M_p;
    builtin_strncpy((char *)local_100._0_8_,"Option must have a name.",0x18);
    local_100._8_8_ = local_a8._M_dataplus._M_p;
    *(char *)(local_100._0_8_ + (long)local_a8._M_dataplus._M_p) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
  }
  else {
    if (iVar4 < 1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x338);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)local_100,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)local_100);
    }
    iVar4 = std::__cxx11::string::compare
                      (*(char **)((long)*(pUVar13->name_).super_RepeatedPtrFieldBase.elements_ +
                                 0x10));
    pMVar2 = local_c0;
    if (iVar4 != 0) {
      this_00 = this->builder_;
      iVar4 = (*(local_c0->super_MessageLite)._vptr_MessageLite[0x13])(local_c0);
      SVar17 = FindSymbolNotEnforcingDepsHelper
                         (this_00,this_00->pool_,*(string **)(CONCAT44(extraout_var,iVar4) + 8));
      aVar12 = SVar17.field_1;
      if (SVar17.type != MESSAGE) {
        aVar12._0_4_ = (*(pMVar2->super_MessageLite)._vptr_MessageLite[0x13])(pMVar2);
        aVar12._4_4_ = extraout_var_00;
      }
      if ((DescriptorBuilder *)aVar12.descriptor == (DescriptorBuilder *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                   ,0x10f9);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_100,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_100);
      }
      local_b8.descriptor = (Descriptor *)0x0;
      local_78 = (FieldDescriptor **)0x0;
      local_88._M_current = (FieldDescriptor **)0x0;
      iStack_80._M_current = (FieldDescriptor **)0x0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      pUVar13 = this->uninterpreted_option_;
      if (0 < (pUVar13->name_).super_RepeatedPtrFieldBase.current_size_) {
        lVar16 = 0;
        do {
          psVar9 = *(string **)
                    ((long)(pUVar13->name_).super_RepeatedPtrFieldBase.elements_[lVar16] + 0x10);
          if (local_a8._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_a8);
            pUVar13 = this->uninterpreted_option_;
          }
          if ((pUVar13->name_).super_RepeatedPtrFieldBase.current_size_ <= lVar16) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar5 = internal::LogMessage::operator<<
                               ((LogMessage *)local_100,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)local_120,pLVar5);
            internal::LogMessage::~LogMessage((LogMessage *)local_100);
          }
          if (*(char *)((long)(pUVar13->name_).super_RepeatedPtrFieldBase.elements_[lVar16] + 0x18)
              == '\x01') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120,"(",psVar9);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_120);
            local_100._0_8_ = local_100 + 0x10;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar10) {
              local_100._16_8_ = *psVar10;
              local_100._24_8_ = plVar6[3];
            }
            else {
              local_100._16_8_ = *psVar10;
              local_100._0_8_ = (size_type *)*plVar6;
            }
            local_100._8_8_ = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_a8,local_100._0_8_);
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
            }
            this_01 = (anon_union_8_7_bfa3a334_for_Symbol_2)this->builder_;
            SVar17 = LookupSymbol((DescriptorBuilder *)this_01.descriptor,psVar9,
                                  &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,
                                  LOOKUP_ALL);
            if (SVar17.type == FIELD) {
              local_b8 = SVar17.field_1;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(psVar9->_M_dataplus)._M_p);
            this_01 = aVar12;
            local_b8.field_descriptor = Descriptor::FindFieldByName(aVar12.descriptor,psVar9);
          }
          if (local_b8.descriptor == (Descriptor *)0x0) {
            if (this->builder_->pool_->allow_unknown_ == true) {
LAB_001d9fb3:
              bVar3 = true;
              AddWithoutInterpreting
                        ((OptionInterpreter *)this_01.descriptor,this->uninterpreted_option_,
                         local_c0);
              goto LAB_001da3a1;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120,"Option \"",&local_a8);
            plVar6 = (long *)std::__cxx11::string::append(local_120);
            local_100._0_8_ = local_100 + 0x10;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar10) {
              local_100._16_8_ = *psVar10;
              local_100._24_8_ = plVar6[3];
            }
            else {
              local_100._16_8_ = *psVar10;
              local_100._0_8_ = (size_type *)*plVar6;
            }
            local_100._8_8_ = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
LAB_001da371:
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
            local_70.field_2._M_allocated_capacity = local_120._16_8_;
            _Var15._M_p = (pointer)local_120._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_120 + 0x10)) {
LAB_001da397:
              operator_delete(_Var15._M_p,
                              (ulong)((long)&(((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                                *)local_70.field_2._M_allocated_capacity)->
                                             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            goto LAB_001da39f;
          }
          if (*(DescriptorBuilder **)(local_b8.descriptor + 0x38) !=
              (DescriptorBuilder *)aVar12.descriptor) {
            if (*(char *)&((*(DescriptorBuilder **)(local_b8.descriptor + 0x38))->
                          options_to_interpret_).
                          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage != '\0')
            goto LAB_001d9fb3;
            std::operator+(&local_70,"Option field \"",&local_a8);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
            pp_Var11 = (_func_int **)(plVar6 + 2);
            if ((_func_int **)*plVar6 == pp_Var11) {
              local_40 = *pp_Var11;
              lStack_38 = plVar6[3];
              local_50.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_40;
            }
            else {
              local_40 = *pp_Var11;
              local_50.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)*plVar6
              ;
            }
            local_50.target_ = (string *)plVar6[1];
            *plVar6 = (long)pp_Var11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_50,**(ulong **)aVar12.descriptor);
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar8) {
              local_120._16_8_ = paVar8->_M_allocated_capacity;
              local_120._24_8_ = plVar6[3];
              local_120._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_120 + 0x10);
            }
            else {
              local_120._16_8_ = paVar8->_M_allocated_capacity;
              local_120._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_120._8_8_ = plVar6[1];
            *plVar6 = (long)paVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append(local_120);
            psVar10 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar10) {
              local_100._16_8_ = *psVar10;
              local_100._24_8_ = plVar6[3];
              local_100._0_8_ = local_100 + 0x10;
            }
            else {
              local_100._16_8_ = *psVar10;
              local_100._0_8_ = (size_type *)*plVar6;
            }
            local_100._8_8_ = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
            }
            if (local_50.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_40) {
              operator_delete(local_50.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                              (ulong)(local_40 + 1));
            }
            _Var15._M_p = local_70._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_001da397;
            goto LAB_001da39f;
          }
          if (*(int *)(local_b8.descriptor + 0x30) == 3) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120,"Option field \"",&local_a8);
            plVar6 = (long *)std::__cxx11::string::append(local_120);
            local_100._0_8_ = local_100 + 0x10;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar10) {
              local_100._16_8_ = *psVar10;
              local_100._24_8_ = plVar6[3];
            }
            else {
              local_100._16_8_ = *psVar10;
              local_100._0_8_ = (size_type *)*plVar6;
            }
            local_100._8_8_ = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
            goto LAB_001da371;
          }
          pUVar13 = this->uninterpreted_option_;
          iVar4 = (pUVar13->name_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar16 < (long)iVar4 + -1) {
            if ((*(uint *)(local_b8.descriptor + 0x2c) & 0xfffffffe) != 10) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,"Option \"",&local_a8);
              plVar6 = (long *)std::__cxx11::string::append(local_120);
              local_100._0_8_ = local_100 + 0x10;
              psVar10 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar10) {
                local_100._16_8_ = *psVar10;
                local_100._24_8_ = plVar6[3];
              }
              else {
                local_100._16_8_ = *psVar10;
                local_100._0_8_ = (size_type *)*plVar6;
              }
              local_100._8_8_ = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
              goto LAB_001da371;
            }
            if (iStack_80._M_current == local_78) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)&local_88,iStack_80,&local_b8.field_descriptor);
            }
            else {
              *iStack_80._M_current = (FieldDescriptor *)local_b8;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            aVar12 = (anon_union_8_7_bfa3a334_for_Symbol_2)
                     ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(local_b8.descriptor + 0x48))->
                     descriptor;
            pUVar13 = this->uninterpreted_option_;
            iVar4 = (pUVar13->name_).super_RepeatedPtrFieldBase.current_size_;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar4);
      }
      iVar14._M_current = iStack_80._M_current;
      intermediate_fields_iter._M_current = local_88._M_current;
      aVar12 = local_b8;
      iVar4 = (*(local_c0->super_MessageLite)._vptr_MessageLite[0x12])();
      pUVar7 = (UnknownFieldSet *)
               (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x10))
                         ((long *)CONCAT44(extraout_var_01,iVar4),local_c0);
      bVar3 = ExamineIfOptionIsSet
                        (this,intermediate_fields_iter,(const_iterator)iVar14._M_current,
                         aVar12.field_descriptor,&local_a8,pUVar7);
      if (bVar3) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(8);
        UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)&paVar8->_M_allocated_capacity);
        local_70._M_dataplus._M_p = (pointer)paVar8;
        bVar3 = SetOptionValue(this,local_b8.field_descriptor,
                               (UnknownFieldSet *)&paVar8->_M_allocated_capacity);
        if (bVar3) {
          if (iStack_80._M_current != local_88._M_current) {
            iVar14._M_current = iStack_80._M_current;
            do {
              pUVar7 = (UnknownFieldSet *)operator_new(8);
              UnknownFieldSet::UnknownFieldSet(pUVar7);
              pFVar1 = iVar14._M_current[-1];
              local_b0.ptr_ = pUVar7;
              if (*(int *)(pFVar1 + 0x2c) == 10) {
                pUVar7 = UnknownFieldSet::AddGroup(pUVar7,*(int *)(pFVar1 + 0x28));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_001da3f7;
                UnknownFieldSet::MergeFrom(pUVar7,(UnknownFieldSet *)local_70._M_dataplus._M_p);
              }
              else {
                if (*(int *)(pFVar1 + 0x2c) != 0xb) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                             ,0x117c);
                  pLVar5 = internal::LogMessage::operator<<
                                     ((LogMessage *)local_100,
                                      "Invalid wire type for CPPTYPE_MESSAGE: ");
                  pLVar5 = internal::LogMessage::operator<<
                                     (pLVar5,*(int *)(iVar14._M_current[-1] + 0x2c));
                  internal::LogFinisher::operator=((LogFinisher *)local_120,pLVar5);
                  internal::LogMessage::~LogMessage((LogMessage *)local_100);
                  internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_b0);
                  goto LAB_001da1d3;
                }
                psVar9 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                                   (pUVar7,*(int *)(pFVar1 + 0x28));
                io::StringOutputStream::StringOutputStream(&local_50,psVar9);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_120,&local_50.super_ZeroCopyOutputStream);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_001da3f7;
                internal::WireFormat::SerializeUnknownFields
                          ((UnknownFieldSet *)local_70._M_dataplus._M_p,
                           (CodedOutputStream *)local_120);
                if (local_120[0x18] == '\x01') {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                             ,0x116f);
                  pLVar5 = internal::LogMessage::operator<<
                                     ((LogMessage *)local_100,"CHECK failed: !out.HadError(): ");
                  pLVar5 = internal::LogMessage::operator<<
                                     (pLVar5,
                                      "Unexpected failure while serializing option submessage ");
                  pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_a8);
                  pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
                  internal::LogFinisher::operator=(&local_c1,pLVar5);
                  internal::LogMessage::~LogMessage((LogMessage *)local_100);
                }
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_120);
                io::StringOutputStream::~StringOutputStream(&local_50);
              }
              p.ptr_ = local_b0.ptr_;
              iVar14._M_current = iVar14._M_current + -1;
              local_b0.ptr_ = (UnknownFieldSet *)0x0;
              internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
                        ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_70,p.ptr_);
              internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_b0);
            } while (iVar14._M_current != local_88._M_current);
          }
          iVar4 = (*(local_c0->super_MessageLite)._vptr_MessageLite[0x12])();
          pUVar7 = (UnknownFieldSet *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x18))
                             ((long *)CONCAT44(extraout_var_02,iVar4),local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_001da3f7:
            __assert_fail("ptr_ != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                          ,0x1de,
                          "C &google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*() const [C = google::protobuf::UnknownFieldSet]"
                         );
          }
          bVar3 = true;
          UnknownFieldSet::MergeFrom(pUVar7,(UnknownFieldSet *)local_70._M_dataplus._M_p);
        }
        else {
LAB_001da1d3:
          bVar3 = false;
        }
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_70);
      }
      else {
LAB_001da39f:
        bVar3 = false;
      }
LAB_001da3a1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (local_88._M_current == (FieldDescriptor **)0x0) {
        return bVar3;
      }
      operator_delete(local_88._M_current,(long)local_78 - (long)local_88._M_current);
      return bVar3;
    }
    local_100._0_8_ = local_100 + 0x10;
    local_a8._M_dataplus._M_p = (char *)0x39;
    local_100._0_8_ = std::__cxx11::string::_M_create((ulong *)local_100,(ulong)&local_a8);
    local_100._16_8_ = local_a8._M_dataplus._M_p;
    builtin_strncpy((char *)local_100._0_8_,
                    "Option must not use reserved name \"uninterpreted_option\".",0x39);
    local_100._8_8_ = local_a8._M_dataplus._M_p;
    *(char *)(local_100._0_8_ + (long)local_a8._M_dataplus._M_p) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_100);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
  }
  return false;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (field->is_repeated()) {
      return AddNameError("Option field \"" + debug_msg_name +
                          "\" is repeated. Repeated options are not "
                          "supported.");
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    scoped_ptr<UnknownFieldSet> parent_unknown_fields(new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}